

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O2

void rr::anon_unknown_19::copyVertexPacketPointers(VertexPacket **dst,TriangleAdjacency *in)

{
  *dst = in->v0;
  dst[1] = in->v1;
  dst[2] = in->v2;
  dst[3] = in->v3;
  dst[4] = in->v4;
  dst[5] = in->v5;
  return;
}

Assistant:

void copyVertexPacketPointers(const VertexPacket** dst, const pa::TriangleAdjacency& in)
{
	dst[0] = in.v0;
	dst[1] = in.v1;
	dst[2] = in.v2;
	dst[3] = in.v3;
	dst[4] = in.v4;
	dst[5] = in.v5;
}